

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBasePrivate::connectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  uint uVar1;
  ProgressData *pPVar2;
  int index1;
  int iVar3;
  long in_FS_OFFSET;
  ResultIteratorBase RVar4;
  QFutureCallOutEvent local_a0;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = this;
  QBasicMutex::lock((QBasicMutex *)this);
  local_48[8] = true;
  uVar1 = (this->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((uVar1 & 2) != 0) {
    QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,Started,-1);
    (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
    pPVar2 = (this->m_progress).d;
    if (pPVar2 == (ProgressData *)0x0) {
      QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,ProgressRange,0,0);
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      QFutureCallOutEvent::QFutureCallOutEvent
                (&local_a0,Progress,this->m_progressValue,(QString *)&local_68);
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    else {
      QFutureCallOutEvent::QFutureCallOutEvent
                (&local_a0,ProgressRange,pPVar2->minimum,pPVar2->maximum);
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
      QFutureCallOutEvent::QFutureCallOutEvent
                (&local_a0,Progress,this->m_progressValue,&((this->m_progress).d)->text);
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
    }
  }
  if (this->hasException == false) {
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    RVar4 = QtPrivate::ResultStoreBase::begin(&(this->data).m_results);
    local_68.d = (Data *)RVar4.mapIterator.i._M_node;
    local_68.ptr = (char16_t *)CONCAT44(local_68.ptr._4_4_,RVar4.m_vectorIndex);
    while( true ) {
      RVar4 = QtPrivate::ResultStoreBase::end(&(this->data).m_results);
      if (((const_iterator)local_68.d == RVar4.mapIterator.i._M_node.i) &&
         ((int)local_68.ptr == RVar4.m_vectorIndex)) break;
      index1 = QtPrivate::ResultIteratorBase::resultIndex((ResultIteratorBase *)&local_68);
      iVar3 = QtPrivate::ResultIteratorBase::batchSize((ResultIteratorBase *)&local_68);
      QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,ResultsReady,index1,iVar3 + index1);
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
      QtPrivate::ResultIteratorBase::batchedAdvance((ResultIteratorBase *)&local_68);
    }
  }
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 0x10) == 0) goto LAB_003897f2;
    QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,Suspending,-1);
    (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
  }
  else {
    QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,Suspended,-1);
    (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
  }
  QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
LAB_003897f2:
  if ((uVar1 & 8) != 0) {
    QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,Canceled,-1);
    (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
  }
  if ((uVar1 & 4) != 0) {
    QFutureCallOutEvent::QFutureCallOutEvent(&local_a0,Finished,-1);
    (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_a0);
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_a0);
  }
  QList<QFutureCallOutInterface_*>::append(&this->outputConnections,iface);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBasePrivate::connectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker locker(&m_mutex);

    const auto currentState = state.loadRelaxed();
    if (currentState & QFutureInterfaceBase::Started) {
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Started));
        if (m_progress) {
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange,
                                                        m_progress->minimum,
                                                        m_progress->maximum));
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                                        m_progressValue,
                                                        m_progress->text));
        } else {
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange,
                                                        0,
                                                        0));
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                                        m_progressValue,
                                                        QString()));
        }
    }

    if (!hasException) {
        QtPrivate::ResultIteratorBase it = data.m_results.begin();
        while (it != data.m_results.end()) {
            const int begin = it.resultIndex();
            const int end = begin + it.batchSize();
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ResultsReady,
                                                        begin,
                                                        end));
            it.batchedAdvance();
        }
    }

    if (currentState & QFutureInterfaceBase::Suspended)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Suspended));
    else if (currentState & QFutureInterfaceBase::Suspending)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Suspending));

    if (currentState & QFutureInterfaceBase::Canceled)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Canceled));

    if (currentState & QFutureInterfaceBase::Finished)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Finished));

    outputConnections.append(iface);
}